

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

HighsStatus __thiscall
HighsIis::getData(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis,
                 vector<int,_std::allocator<int>_> *infeasible_row)

{
  int iVar1;
  HighsStatus HVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<int,_std::allocator<int>_> *pvVar6;
  int *in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  HighsInt iRow_2;
  HighsInt iCol_2;
  HighsInt iRow_1;
  bool has_row_names;
  HighsInt iRow;
  HighsInt iEl_1;
  HighsInt iCol_1;
  bool has_col_names;
  HighsLp to_lp;
  HighsInt to_num_row;
  HighsInt to_num_col;
  HighsInt iEl;
  bool use_col;
  HighsInt iCol;
  HighsInt iX;
  vector<int,_std::allocator<int>_> to_row;
  vector<int,_std::allocator<int>_> from_col;
  vector<int,_std::allocator<int>_> from_row;
  HighsBasis *in_stack_00005410;
  HighsOptions *in_stack_00005418;
  HighsLp *in_stack_00005420;
  HighsIis *in_stack_00005428;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  value_type vVar7;
  int in_stack_fffffffffffffad0;
  value_type in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  int iVar8;
  undefined4 in_stack_fffffffffffffadc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffae0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb20;
  HighsLp *in_stack_fffffffffffffb50;
  vector<double,_std::allocator<double>_> *pvVar9;
  bool local_48d;
  int local_470;
  int local_46c;
  int local_464;
  int local_454;
  int local_448;
  vector<int,_std::allocator<int>_> local_380 [30];
  int local_a4;
  int local_a0;
  int local_9c;
  byte local_95;
  int local_94;
  int local_90;
  undefined4 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> *local_30;
  int *local_18;
  HighsStatus local_4;
  
  local_30 = in_R8;
  local_18 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4ce3b1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4ce3c6);
  local_7c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
             CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             (value_type_conflict2 *)0x4ce3f2);
  local_90 = 0;
  while( true ) {
    iVar8 = local_90;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_30);
    iVar1 = local_90;
    if ((int)sVar3 <= iVar8) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_90);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar4);
    *pvVar5 = iVar1;
    local_90 = local_90 + 1;
  }
  for (local_94 = 0; local_94 < *local_18; local_94 = local_94 + 1) {
    local_95 = 0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)local_94);
    local_9c = *pvVar4;
    while( true ) {
      iVar8 = local_9c;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),
                          (long)(local_94 + 1));
      if (*pvVar4 <= iVar8) break;
      local_48d = true;
      if ((local_95 & 1) == 0) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x30),(long)local_9c);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar4);
        local_48d = -1 < *pvVar5;
      }
      local_95 = local_48d;
      local_9c = local_9c + 1;
    }
    if ((local_95 & 1) != 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_60);
  local_a0 = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48);
  local_a4 = (int)sVar3;
  HighsLp::HighsLp(in_stack_fffffffffffffb50);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_18 + 0x52));
  for (local_448 = 0; local_448 < local_a0; local_448 = local_448 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)
              );
    pvVar9 = (vector<double,_std::allocator<double>_> *)(local_18 + 8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_448);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)*pvVar5);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffae0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
              );
    pvVar9 = (vector<double,_std::allocator<double>_> *)(local_18 + 0xe);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_448);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)*pvVar5);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffae0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
              );
    if (sVar3 != 0) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_18 + 0x52);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_00,(long)*pvVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffae0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
    pvVar6 = (vector<int,_std::allocator<int>_> *)(local_18 + 0x24);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_448);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)*pvVar5);
    local_454 = *pvVar4;
    while( true ) {
      pvVar6 = (vector<int,_std::allocator<int>_> *)(local_18 + 0x24);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_448);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(*pvVar5 + 1));
      if (*pvVar4 <= local_454) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x30),(long)local_454);
      iVar8 = *pvVar4;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar8);
      if (-1 < *pvVar5) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_18 + 0x36),(long)local_454);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffae0,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      }
      local_454 = local_454 + 1;
    }
    std::vector<int,_std::allocator<int>_>::size(local_380);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)
              );
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_18 + 0x58));
  for (local_464 = 0; local_464 < local_a4; local_464 = local_464 + 1) {
    pvVar9 = (vector<double,_std::allocator<double>_> *)(local_18 + 0x14);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_464);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)*pvVar5);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffae0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
              );
    pvVar9 = (vector<double,_std::allocator<double>_> *)(local_18 + 0x1a);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_464);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)*pvVar5);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffae0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
              );
    if (sVar3 != 0) {
      in_stack_fffffffffffffae0 = (vector<double,_std::allocator<double>_> *)(local_18 + 0x58);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_464);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffae0,(long)*pvVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffae0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
  }
  HVar2 = compute(in_stack_00005428,in_stack_00005420,in_stack_00005418,in_stack_00005410);
  if (HVar2 == kOk) {
    local_46c = 0;
    while( true ) {
      iVar8 = local_46c;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
      if ((int)sVar3 <= iVar8) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_46c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)*pvVar5);
      in_stack_fffffffffffffad4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_46c);
      *pvVar5 = in_stack_fffffffffffffad4;
      local_46c = local_46c + 1;
    }
    local_470 = 0;
    while( true ) {
      in_stack_fffffffffffffad0 = local_470;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
      if ((int)sVar3 <= in_stack_fffffffffffffad0) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_470);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar5);
      vVar7 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_470);
      *pvVar5 = vVar7;
      local_470 = local_470 + 1;
    }
    local_4 = kOk;
  }
  else {
    local_4 = kError;
  }
  HighsLp::~HighsLp((HighsLp *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  return local_4;
}

Assistant:

HighsStatus HighsIis::getData(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis& basis,
                              const std::vector<HighsInt>& infeasible_row) {
  // Check for trivial IIS should have been done earlier
  assert(!this->trivial(lp, options));
  // The number of infeasible rows must be positive
  assert(infeasible_row.size() > 0);
  // Identify the LP corresponding to the set of infeasible rows
  std::vector<HighsInt> from_row = infeasible_row;
  std::vector<HighsInt> from_col;
  std::vector<HighsInt> to_row;
  to_row.assign(lp.num_row_, -1);
  assert(lp.a_matrix_.isColwise());
  // Determine how to detect whether a row is in infeasible_row and
  // (then) gather information about it
  for (HighsInt iX = 0; iX < HighsInt(infeasible_row.size()); iX++)
    to_row[infeasible_row[iX]] = iX;
  // Identify the columns (from_col) with nonzeros in the infeasible
  // rows
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    bool use_col = false;
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      use_col = use_col || to_row[lp.a_matrix_.index_[iEl]] >= 0;
    if (use_col) from_col.push_back(iCol);
  }
  HighsInt to_num_col = from_col.size();
  HighsInt to_num_row = from_row.size();
  HighsLp to_lp;
  to_lp.num_col_ = to_num_col;
  to_lp.num_row_ = to_num_row;
  to_lp.a_matrix_.num_col_ = to_lp.num_col_;
  to_lp.a_matrix_.num_row_ = to_lp.num_row_;
  const bool has_col_names = lp.col_names_.size() > 0;
  for (HighsInt iCol = 0; iCol < to_num_col; iCol++) {
    to_lp.col_cost_.push_back(0);
    to_lp.col_lower_.push_back(lp.col_lower_[from_col[iCol]]);
    to_lp.col_upper_.push_back(lp.col_upper_[from_col[iCol]]);
    if (has_col_names)
      to_lp.col_names_.push_back(lp.col_names_[from_col[iCol]]);
    for (HighsInt iEl = lp.a_matrix_.start_[from_col[iCol]];
         iEl < lp.a_matrix_.start_[from_col[iCol] + 1]; iEl++) {
      HighsInt iRow = lp.a_matrix_.index_[iEl];
      if (to_row[iRow] >= 0) {
        to_lp.a_matrix_.index_.push_back(to_row[iRow]);
        to_lp.a_matrix_.value_.push_back(lp.a_matrix_.value_[iEl]);
      }
    }
    to_lp.a_matrix_.start_.push_back(to_lp.a_matrix_.index_.size());
  }
  const bool has_row_names = lp.row_names_.size() > 0;
  for (HighsInt iRow = 0; iRow < to_num_row; iRow++) {
    to_lp.row_lower_.push_back(lp.row_lower_[from_row[iRow]]);
    to_lp.row_upper_.push_back(lp.row_upper_[from_row[iRow]]);
    if (has_row_names)
      to_lp.row_names_.push_back(lp.row_names_[from_row[iRow]]);
  }
  if (this->compute(to_lp, options) != HighsStatus::kOk)
    return HighsStatus::kError;
  // Indirect the values into the original LP
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_index_.size()); iCol++)
    this->col_index_[iCol] = from_col[this->col_index_[iCol]];
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_index_.size()); iRow++)
    this->row_index_[iRow] = from_row[this->row_index_[iRow]];
  if (kIisDevReport) this->report("On exit", lp);
  return HighsStatus::kOk;
}